

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::InternalSwap
          (RandomUniformStaticLayerParams *this,RandomUniformStaticLayerParams *other)

{
  float fVar1;
  int iVar2;
  int64 iVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  iVar3 = this->seed_;
  this->seed_ = other->seed_;
  other->seed_ = iVar3;
  fVar1 = this->minval_;
  this->minval_ = other->minval_;
  other->minval_ = fVar1;
  fVar1 = this->maxval_;
  this->maxval_ = other->maxval_;
  other->maxval_ = fVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void RandomUniformStaticLayerParams::InternalSwap(RandomUniformStaticLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(seed_, other->seed_);
  std::swap(minval_, other->minval_);
  std::swap(maxval_, other->maxval_);
  std::swap(_cached_size_, other->_cached_size_);
}